

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall fineftp::FtpSession::sendRawFtpMessage(FtpSession *this,string *raw_message)

{
  pointer pcVar1;
  strand_service *psVar2;
  implementation_type psVar3;
  scheduler_operation *psVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcVar7;
  scheduler_operation *psVar8;
  undefined8 uVar9;
  long *in_FS_OFFSET;
  ptr local_70;
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38 [3];
  
  ::std::__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fineftp::FtpSession,void>
            ((__shared_ptr<fineftp::FtpSession,(__gnu_cxx::_Lock_policy)2> *)local_58,
             (__weak_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2> *)this);
  pcVar1 = (raw_message->_M_dataplus)._M_p;
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + raw_message->_M_string_length);
  psVar2 = (this->command_write_strand_).service_;
  if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x10) + 8);
  }
  local_70.h = (anon_class_48_2_3c81cf3a_for_handler_ *)local_58;
  pcVar7 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
            *)asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar9,0x50);
  local_70.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  (pcVar7->super_operation).next_ = (scheduler_operation *)0x0;
  (pcVar7->super_operation).func_ =
       asio::detail::
       completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
       ::do_complete;
  (pcVar7->super_operation).task_result_ = 0;
  uVar5 = local_58._8_4_;
  uVar6 = local_58._12_4_;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_58._0_4_;
  *(undefined4 *)
   ((long)&(pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr + 4) = local_58._4_4_;
  *(undefined4 *)
   &(pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar5;
  *(undefined4 *)
   ((long)&(pcVar7->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 4) = uVar6;
  local_58._0_8_ = 0;
  (pcVar7->handler_).raw_message._M_dataplus._M_p = (pointer)&(pcVar7->handler_).raw_message.field_2
  ;
  local_70.v = pcVar7;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(pcVar7->handler_).raw_message,local_48,local_40 + (long)local_48);
  local_70.p = pcVar7;
  pthread_mutex_lock((pthread_mutex_t *)&((this->command_write_strand_).impl_)->mutex_);
  psVar3 = (this->command_write_strand_).impl_;
  if (psVar3->locked_ == true) {
    (pcVar7->super_operation).next_ = (scheduler_operation *)0x0;
    psVar4 = (psVar3->waiting_queue_).back_;
    psVar8 = (scheduler_operation *)&psVar3->waiting_queue_;
    if (psVar4 != (scheduler_operation *)0x0) {
      psVar8 = psVar4;
    }
    psVar8->next_ = (scheduler_operation *)pcVar7;
    (psVar3->waiting_queue_).back_ = (scheduler_operation *)pcVar7;
    pthread_mutex_unlock((pthread_mutex_t *)&((this->command_write_strand_).impl_)->mutex_);
  }
  else {
    psVar3->locked_ = true;
    pthread_mutex_unlock((pthread_mutex_t *)&psVar3->mutex_);
    psVar3 = (this->command_write_strand_).impl_;
    (pcVar7->super_operation).next_ = (scheduler_operation *)0x0;
    psVar4 = (psVar3->ready_queue_).back_;
    psVar8 = (scheduler_operation *)&psVar3->ready_queue_;
    if (psVar4 != (scheduler_operation *)0x0) {
      psVar8 = psVar4;
    }
    psVar8->next_ = (scheduler_operation *)pcVar7;
    (psVar3->ready_queue_).back_ = (scheduler_operation *)pcVar7;
    asio::detail::scheduler::post_immediate_completion
              (psVar2->io_context_impl_,&((this->command_write_strand_).impl_)->super_operation,
               false);
  }
  local_70.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  local_70.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  asio::detail::
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  ::ptr::reset(&local_70);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  return;
}

Assistant:

void FtpSession::sendRawFtpMessage(const std::string& raw_message)
  {
    command_write_strand_.post([me = shared_from_this(), raw_message]()
                                {
                                  bool write_in_progress = !me->command_output_queue_.empty();
                                  me->command_output_queue_.push_back(raw_message);
                                  if (!write_in_progress)
                                  {
                                    me->startSendingMessages();
                                  }
                                });
  }